

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::deinit(TextureCubeMapArrayStencilAttachments *this)

{
  CubeMapArrayDataStorage *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  long lVar3;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x4e8))(0xb90);
  cleanAfterTest(this);
  (**(code **)(lVar3 + 0xd8))(0);
  if (this->m_vbo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_vbo_id);
    this->m_vbo_id = 0;
  }
  if (this->m_fbo_draw_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_draw_id);
    this->m_fbo_draw_id = 0;
  }
  if (this->m_fbo_read_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_read_id);
    this->m_fbo_read_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  pCVar1 = this->m_cube_map_array_data;
  if (pCVar1 != (CubeMapArrayDataStorage *)0x0) {
    lVar3 = *(long *)&pCVar1[-1].m_width;
    if (lVar3 != 0) {
      lVar4 = lVar3 * 0x18;
      do {
        CubeMapArrayDataStorage::deinit
                  ((CubeMapArrayDataStorage *)((long)&pCVar1[-1].m_data_array + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    operator_delete__(&pCVar1[-1].m_width,lVar3 * 0x18 + 8);
    this->m_cube_map_array_data = (CubeMapArrayDataStorage *)0x0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Disable the stencil test */
	gl.disable(GL_STENCIL_TEST);

	/* If any of the iterations have broken, we should clean up here. */
	cleanAfterTest();

	gl.bindVertexArray(0);

	/* Release test-wide objects */
	if (m_vbo_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_id);

		m_vbo_id = 0;
	}

	if (m_fbo_draw_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_draw_id);

		m_fbo_draw_id = 0;
	}

	if (m_fbo_read_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_read_id);

		m_fbo_read_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_cube_map_array_data != DE_NULL)
	{
		delete[] m_cube_map_array_data;

		m_cube_map_array_data = DE_NULL;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}